

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O3

QSize __thiscall QDockWidgetGroupWindowItem::maximumSize(QDockWidgetGroupWindowItem *this)

{
  int iVar1;
  QWidget *this_00;
  QSize QVar2;
  undefined4 extraout_var;
  QLayout *pQVar3;
  
  iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
  this_00 = (QWidget *)qt_qFindChild_helper(iVar1,0,0,&QDockWidget::staticMetaObject,1);
  if (this_00 != (QWidget *)0x0) {
    QVar2 = QWidget::maximumSize(this_00);
    return QVar2;
  }
  iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(this);
  pQVar3 = QWidget::layout((QWidget *)CONCAT44(extraout_var,iVar1));
  QVar2 = (QSize)(**(code **)(*(long *)pQVar3 + 0x98))(pQVar3);
  return QVar2;
}

Assistant:

QSize maximumSize() const override
    {
        auto dw = widget()->findChild<QDockWidget *>();
        if (dw)
            return dw->maximumSize();
        return lay()->maximumSize();
    }